

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

void __thiscall djb::tab::normalize_ndf(tab *this)

{
  float fVar1;
  size_type sVar2;
  reference pvVar3;
  reference a;
  float_t fVar4;
  int local_44;
  int local_40;
  int i_1;
  int i;
  vec2 local_30;
  float local_28;
  float_t nrm;
  vec2 local_18;
  tab *local_10;
  tab *this_local;
  
  local_10 = this;
  vec2::vec2(&local_18,1.0,1.0);
  vec3::vec3((vec3 *)&stack0xffffffffffffffdc,0.0,0.0,1.0);
  fVar4 = cdf(this,&local_18,(vec3 *)&stack0xffffffffffffffdc);
  if (fVar4 <= 0.0) {
    __assert_fail("cdf(vec2(1, 1), vec3(0, 0, 1)) > 0 && \"Invalid NDF normalization\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/demo-merl/dj_brdf.h"
                  ,0x850,"void djb::tab::normalize_ndf()");
  }
  vec2::vec2(&local_30,1.0,1.0);
  vec3::vec3((vec3 *)&i_1,0.0,0.0,1.0);
  fVar4 = cdf(this,&local_30,(vec3 *)&i_1);
  local_28 = 1.0 / fVar4;
  for (local_40 = 0; sVar2 = std::vector<float,_std::allocator<float>_>::size(&this->m_ndf),
      fVar1 = local_28, local_40 < (int)sVar2; local_40 = local_40 + 1) {
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](&this->m_ndf,(long)local_40);
    *pvVar3 = fVar1 * *pvVar3;
  }
  for (local_44 = 0; sVar2 = std::vector<djb::vec2,_std::allocator<djb::vec2>_>::size(&this->m_cdf),
      fVar1 = local_28, local_44 < (int)sVar2; local_44 = local_44 + 1) {
    a = std::vector<djb::vec2,_std::allocator<djb::vec2>_>::operator[](&this->m_cdf,(long)local_44);
    operator*=(a,fVar1);
  }
  fprintf(_stdout,"djb_verbose: NDF norm. constant = %.9f\n",(double)local_28);
  return;
}

Assistant:

void tab::normalize_ndf()
{
	DJB_ASSERT(cdf(vec2(1, 1), vec3(0, 0, 1)) > 0 && "Invalid NDF normalization");
	float_t nrm = 1 / cdf(vec2(1, 1), vec3(0, 0, 1));

	for (int i = 0; i < (int)m_ndf.size(); ++i)
		m_ndf[i]*= nrm;

	for (int i = 0; i < (int)m_cdf.size(); ++i)
		m_cdf[i]*= nrm;

#ifndef NVERBOSE
	DJB_LOG("djb_verbose: NDF norm. constant = %.9f\n", (double)nrm);
#endif
}